

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnDiskIndex.cpp
# Opt level: O1

void OnDiskIndex::on_disk_merge
               (path *db_base,string *fname,IndexType merge_type,
               vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_> *indexes,TaskSpec *task)

{
  pointer pIVar1;
  runtime_error *this;
  pointer pIVar2;
  pointer pIVar3;
  long lVar4;
  RawFile out;
  OnDiskIndexHeader header;
  RawFile local_c4;
  string local_c0;
  path local_a0;
  path local_60;
  
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>(&local_60,fname);
  std::experimental::filesystem::v1::__cxx11::path::path(&local_a0,db_base);
  std::experimental::filesystem::v1::__cxx11::path::_M_append(&local_a0,&local_60._M_pathname);
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c0,local_a0._M_pathname._M_dataplus._M_p,
             local_a0._M_pathname._M_dataplus._M_p +
             CONCAT44(local_a0._M_pathname._M_string_length._4_4_,
                      (IndexType)local_a0._M_pathname._M_string_length));
  RawFile::RawFile(&local_c4,&local_c0,0xc1,0x180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_a0);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_60);
  pIVar3 = (indexes->super__Vector_base<IndexMergeHelper,_std::allocator<IndexMergeHelper>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pIVar1 = (indexes->super__Vector_base<IndexMergeHelper,_std::allocator<IndexMergeHelper>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  lVar4 = ((long)pIVar1 - (long)pIVar3 >> 3) * -0x3333333333333333 >> 2;
  pIVar2 = pIVar3;
  if (0 < lVar4) {
    pIVar2 = pIVar3 + lVar4 * 4;
    lVar4 = lVar4 + 1;
    pIVar3 = pIVar3 + 2;
    do {
      if ((pIVar3[-2].index)->ntype != merge_type) {
        pIVar3 = pIVar3 + -2;
        goto LAB_00154beb;
      }
      if ((pIVar3[-1].index)->ntype != merge_type) {
        pIVar3 = pIVar3 + -1;
        goto LAB_00154beb;
      }
      if (pIVar3->index->ntype != merge_type) goto LAB_00154beb;
      if ((pIVar3[1].index)->ntype != merge_type) {
        pIVar3 = pIVar3 + 1;
        goto LAB_00154beb;
      }
      lVar4 = lVar4 + -1;
      pIVar3 = pIVar3 + 4;
    } while (1 < lVar4);
  }
  lVar4 = ((long)pIVar1 - (long)pIVar2 >> 3) * -0x3333333333333333;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      pIVar3 = pIVar1;
      if ((lVar4 != 3) || (pIVar3 = pIVar2, pIVar2->index->ntype != merge_type)) goto LAB_00154beb;
      pIVar2 = pIVar2 + 1;
    }
    pIVar3 = pIVar2;
    if (pIVar2->index->ntype != merge_type) goto LAB_00154beb;
    pIVar2 = pIVar2 + 1;
  }
  pIVar3 = pIVar2;
  if (pIVar2->index->ntype == merge_type) {
    pIVar3 = pIVar1;
  }
LAB_00154beb:
  if (pIVar3 != pIVar1) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Unexpected index type during merge");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_a0._M_pathname._M_dataplus._M_p = (pointer)0x60ca7da7a;
  local_a0._M_pathname._M_string_length._4_4_ = 0;
  local_a0._M_pathname._M_string_length._0_4_ = merge_type;
  RawFile::write<unsigned_char>(&local_c4,(uchar *)&local_a0,0x10);
  on_disk_merge_core(indexes,&local_c4,task);
  RawFile::~RawFile(&local_c4);
  return;
}

Assistant:

void OnDiskIndex::on_disk_merge(const fs::path &db_base,
                                const std::string &fname, IndexType merge_type,
                                const std::vector<IndexMergeHelper> &indexes,
                                TaskSpec *task) {
    RawFile out(db_base / fname, O_WRONLY | O_CREAT | O_EXCL, 0600);

    if (!std::all_of(indexes.begin(), indexes.end(),
                     [merge_type](const IndexMergeHelper &ndx) {
                         return ndx.index->ntype == merge_type;
                     })) {
        throw std::runtime_error("Unexpected index type during merge");
    }

    OnDiskIndexHeader header;
    header.magic = DB_MAGIC;
    header.version = OnDiskIndex::VERSION;
    header.raw_type = static_cast<uint32_t>(merge_type);
    header.reserved = 0;

    out.write(reinterpret_cast<uint8_t *>(&header), sizeof(header));

    on_disk_merge_core(indexes, &out, task);
}